

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtmpfil.cpp
# Opt level: O3

vm_obj_id_t CVmObjTemporaryFile::create_from_stack(uchar **pc_ptr,uint argc)

{
  int iVar1;
  vm_obj_id_t obj_id;
  CVmObjTemporaryFile *self;
  vm_tmpfil_ext *pvVar2;
  char fname [4096];
  char acStack_1018 [4096];
  
  if (argc != 0) {
    err_throw(0x899);
  }
  iVar1 = os_gen_temp_filename(acStack_1018,0x1000);
  if (iVar1 != 0) {
    obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,0,0,0);
    self = (CVmObjTemporaryFile *)CVmObject::operator_new(0x10,obj_id);
    (self->super_CVmObject)._vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_00326320;
    pvVar2 = vm_tmpfil_ext::alloc_ext(self,acStack_1018);
    (self->super_CVmObject).ext_ = pvVar2->filename;
    *(ushort *)&G_obj_table_X.pages_[obj_id >> 0xc][obj_id & 0xfff].field_0x14 =
         *(ushort *)&G_obj_table_X.pages_[obj_id >> 0xc][obj_id & 0xfff].field_0x14 | 0x80;
    return obj_id;
  }
  err_throw(0x68);
}

Assistant:

vm_obj_id_t CVmObjTemporaryFile::create_from_stack(
    VMG_ const uchar **pc_ptr, uint argc)
{
    /* check arguments */
    if (argc != 0)
        err_throw(VMERR_WRONG_NUM_OF_ARGS);

    /* generate a temporary filename in the local file system */
    char fname[OSFNMAX];
    if (!os_gen_temp_filename(fname, sizeof(fname)))
        err_throw(VMERR_CREATE_FILE);

    /* allocate the object ID and create the object */
    vm_obj_id_t id = vm_new_id(vmg_ FALSE, FALSE, FALSE);
    new (vmg_ id) CVmObjTemporaryFile(vmg_ fname);

    /* temporary file objects are always transient */
    G_obj_table->set_obj_transient(id);

    /* return the new ID */
    return id;
}